

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O2

int h262_mb_addr_inc(bitstream *str,uint32_t *val)

{
  int iVar1;
  uint uVar2;
  uint32_t tmp_1;
  uint32_t tmp;
  uint32_t c33;
  
  if (str->dir == VS_ENCODE) {
    uVar2 = *val;
    c33 = 0x21;
    for (; tmp_1 = uVar2, 0x20 < uVar2; uVar2 = uVar2 - 0x21) {
      iVar1 = vs_vlc(str,&c33,mbai_vlc);
      if (iVar1 != 0) {
        return 1;
      }
    }
    iVar1 = vs_vlc(str,&tmp_1,mbai_vlc);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    *val = 0;
    while (iVar1 = vs_vlc(str,&tmp,mbai_vlc), iVar1 == 0) {
      if (tmp != 0x22) {
        if (tmp != 0x21) {
          *val = *val + tmp;
          return 0;
        }
        *val = *val + 0x21;
      }
    }
  }
  return 1;
}

Assistant:

int h262_mb_addr_inc(struct bitstream *str, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		uint32_t tmp = *val, c33 = 33;
		while (tmp > 32) {
			if (vs_vlc(str, &c33, mbai_vlc)) return 1;
			tmp -= 33;
		}
		if (vs_vlc(str, &tmp, mbai_vlc)) return 1;
	} else {
		*val = 0;
		uint32_t tmp;
		while (1) {
			if (vs_vlc(str, &tmp, mbai_vlc)) return 1;
			if (tmp == 33) {
				*val += 33;
			} else if (tmp == 34) {
				/* stuffing */
			} else {
				*val += tmp;
				break;
			}
		}
	}
	return 0;
}